

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTestCaseBase.cpp
# Opt level: O2

string * __thiscall
glcts::TestCaseBase::specializeShader_abi_cxx11_
          (string *__return_storage_ptr__,TestCaseBase *this,uint parts,char **code)

{
  ulong uVar1;
  stringstream code_merged;
  allocator<char> local_219;
  char *local_218 [4];
  string local_1f8;
  StringTemplate local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8;
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  for (uVar1 = 0; parts != uVar1; uVar1 = uVar1 + 1) {
    std::operator<<(&local_1a8,code[uVar1]);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,local_218[0],&local_219);
  tcu::StringTemplate::StringTemplate(&local_1d8,&local_1f8);
  tcu::StringTemplate::specialize(__return_storage_ptr__,&local_1d8,&this->m_specializationMap);
  tcu::StringTemplate::~StringTemplate(&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)local_218);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string TestCaseBase::specializeShader(const unsigned int parts, const char* const* code) const
{
	std::stringstream code_merged;
	for (unsigned int i = 0; i < parts; i++)
	{
		code_merged << code[i];
	}
	return tcu::StringTemplate(code_merged.str().c_str()).specialize(m_specializationMap);
}